

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerLdArrViewElem(Lowerer *this,Instr *instr)

{
  uint offset;
  RegOpnd *indexOpnd;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  JITTimeFunctionBody *pJVar4;
  undefined4 *puVar5;
  IndirOpnd *pIVar6;
  AsmJsJITInfo *this_00;
  Instr *insertBeforeInstr;
  intptr_t pMemLoc;
  IntConstOpnd *newSrc;
  Instr *pIVar7;
  Func *pFVar8;
  Lowerer *in_stack_ffffffffffffffb0;
  
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2515,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) goto LAB_00552db3;
    *puVar5 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2516,"(instr)","instr");
    if (!bVar2) goto LAB_00552db3;
    *puVar5 = 0;
  }
  if (instr->m_opcode != LdArrViewElem) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2517,"(instr->m_opcode == Js::OpCode::LdArrViewElem)",
                       "instr->m_opcode == Js::OpCode::LdArrViewElem");
    if (!bVar2) goto LAB_00552db3;
    *puVar5 = 0;
  }
  pIVar7 = instr->m_prev;
  pIVar6 = IR::Opnd::AsIndirOpnd(instr->m_src1);
  indexOpnd = pIVar6->m_indexOpnd;
  pIVar6 = IR::Opnd::AsIndirOpnd(instr->m_src1);
  offset = pIVar6->m_offset;
  dst = instr->m_dst;
  src2 = instr->m_src2;
  if ((int)offset < 0) {
    IVar3 = dst->m_type;
    pFVar8 = this->m_func;
    if (IVar3 == TyFloat64) {
      pMemLoc = ThreadContextInfo::GetDoubleNaNAddr(pFVar8->m_threadContextInfo);
      pFVar8 = this->m_func;
      IVar3 = TyFloat64;
    }
    else {
      if (IVar3 != TyFloat32) {
        newSrc = IR::IntConstOpnd::New(0,IVar3,pFVar8,false);
        goto LAB_00552d53;
      }
      pMemLoc = ThreadContextInfo::GetFloatNaNAddr(pFVar8->m_threadContextInfo);
      pFVar8 = this->m_func;
      IVar3 = TyFloat32;
    }
    newSrc = (IntConstOpnd *)IR::MemRefOpnd::New(pMemLoc,IVar3,pFVar8,AddrOpndKindDynamicMisc);
LAB_00552d53:
    IR::Instr::ReplaceSrc1(instr,&newSrc->super_Opnd);
    if (src2 != (Opnd *)0x0) {
      IR::Instr::FreeSrc2(instr);
    }
    pIVar7 = LowererMD::ChangeToAssign(instr);
    return pIVar7;
  }
  src1 = instr->m_src1;
  if (indexOpnd == (RegOpnd *)0x0) {
    pJVar4 = Func::GetJITFunctionBody(this->m_func);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar4);
    bVar2 = AsmJsJITInfo::AccessNeedsBoundCheck(this_00,offset);
    if (!bVar2) {
      IR::Instr::UnlinkDst(instr);
      IR::Instr::UnlinkSrc1(instr);
      insertBeforeInstr = instr;
      if (src2 != (Opnd *)0x0) {
        IR::Instr::FreeSrc2(instr);
      }
      goto LAB_00552cd2;
    }
  }
  IVar3 = dst->m_type;
  if (IVar3 == TyFloat32) {
    if (src1->m_type != TyFloat32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2546,"(!dst->IsFloat32() || src1->IsFloat32())",
                         "!dst->IsFloat32() || src1->IsFloat32()");
      if (!bVar2) goto LAB_00552db3;
      *puVar5 = 0;
      IVar3 = dst->m_type;
      goto LAB_00552c5f;
    }
  }
  else {
LAB_00552c5f:
    if ((IVar3 == TyFloat64) && (src1->m_type != TyFloat64)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2547,"(!dst->IsFloat64() || src1->IsFloat64())",
                         "!dst->IsFloat64() || src1->IsFloat64()");
      if (!bVar2) {
LAB_00552db3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  insertBeforeInstr = LowererMD::LowerAsmJsLdElemHelper(&this->m_lowererMD,instr);
LAB_00552cd2:
  InsertMaskableMove(false,true,dst,src1,src2,&indexOpnd->super_Opnd,insertBeforeInstr,
                     in_stack_ffffffffffffffb0);
  IR::Instr::Remove(instr);
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LowerLdArrViewElem(IR::Instr * instr)
{
#ifdef ASMJS_PLAT
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdArrViewElem);

    IR::Instr * instrPrev = instr->m_prev;

    IR::RegOpnd * indexOpnd = instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd();
    int32 offset = instr->GetSrc1()->AsIndirOpnd()->GetOffset();

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    IR::Instr * done;

    if (offset < 0)
    {
        IR::Opnd * oobValue = nullptr;
        if(dst->IsFloat32())
        {
            oobValue = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetFloatNaNAddr(), TyFloat32, m_func);
        }
        else if(dst->IsFloat64())
        {
            oobValue = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetDoubleNaNAddr(), TyFloat64, m_func);
        }
        else
        {
            oobValue = IR::IntConstOpnd::New(0, dst->GetType(), m_func);
        }
        instr->ReplaceSrc1(oobValue);
        if (src2)
        {
            instr->FreeSrc2();
        }
        return m_lowererMD.ChangeToAssign(instr);
    }
    if (indexOpnd || m_func->GetJITFunctionBody()->GetAsmJsInfo()->AccessNeedsBoundCheck((uint32)offset))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $load
        // $helper:
        // MOV dst, 0
        // JMP $done
        // $load:
        // MOV dst, src1([arrayBuffer + indexOpnd])
        // $done:

        Assert(!dst->IsFloat32() || src1->IsFloat32());
        Assert(!dst->IsFloat64() || src1->IsFloat64());
        done = m_lowererMD.LowerAsmJsLdElemHelper(instr);
    }
    else
    {
        // any access below 0x10000 is safe
        instr->UnlinkDst();
        instr->UnlinkSrc1();
        if (src2)
        {
            instr->FreeSrc2();
        }
        done = instr;
    }

    InsertMaskableMove(false, true, dst, src1, src2, indexOpnd, done, this);

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}